

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_flags_encoder.c
# Opt level: O0

lzma_ret lzma_stream_footer_encode(lzma_stream_flags *options,uint8_t *out)

{
  _Bool _Var1;
  uint32_t num;
  uint32_t crc;
  uint8_t *out_local;
  lzma_stream_flags *options_local;
  
  if (options->version == 0) {
    _Var1 = is_backward_size_valid(options);
    if (_Var1) {
      write32ne(out + 4,(int)(options->backward_size >> 2) - 1);
      _Var1 = stream_flags_encode(options,out + 8);
      if (_Var1) {
        options_local._4_4_ = LZMA_PROG_ERROR;
      }
      else {
        num = lzma_crc32(out + 4,6,0);
        write32ne(out,num);
        *(uint8_t (*) [2])(out + 10) = (uint8_t  [2])0x5a59;
        options_local._4_4_ = LZMA_OK;
      }
    }
    else {
      options_local._4_4_ = LZMA_PROG_ERROR;
    }
  }
  else {
    options_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  return options_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_stream_footer_encode(const lzma_stream_flags *options, uint8_t *out)
{
	uint32_t crc;

	assert(2 * 4 + LZMA_STREAM_FLAGS_SIZE + sizeof(lzma_footer_magic)
			== LZMA_STREAM_HEADER_SIZE);

	if (options->version != 0)
		return LZMA_OPTIONS_ERROR;

	// Backward Size
	if (!is_backward_size_valid(options))
		return LZMA_PROG_ERROR;

	unaligned_write32le(out + 4, options->backward_size / 4 - 1);

	// Stream Flags
	if (stream_flags_encode(options, out + 2 * 4))
		return LZMA_PROG_ERROR;

	// CRC32
	crc = lzma_crc32(
			out + 4, 4 + LZMA_STREAM_FLAGS_SIZE, 0);

	unaligned_write32le(out, crc);

	// Magic
	memcpy(out + 2 * 4 + LZMA_STREAM_FLAGS_SIZE,
			lzma_footer_magic, sizeof(lzma_footer_magic));

	return LZMA_OK;
}